

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_iterator_suite.cpp
# Opt level: O0

void dereference_suite::overwrite_array(void)

{
  type v;
  reference this;
  basic_variable<std::allocator<char>_> *lhs;
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_1e8;
  nullable local_1e0 [2];
  size_type local_1d8 [2];
  undefined1 local_1c8 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_198,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_168,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_138,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_108,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_1e8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1e8 = local_1e8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1e8);
  } while (local_1e8 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            ((iterator *)local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  this = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator*
                   ((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator=(this,null);
  local_1d8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::size
                           ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1e0[1] = 7;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","7",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x881,"void dereference_suite::overwrite_array()",local_1d8,local_1e0 + 1);
  lhs = trial::dynamic::basic_variable<std::allocator<char>_>::operator[]
                  ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),0);
  local_1e0[0] = null;
  v = trial::dynamic::operator==(lhs,local_1e0);
  boost::detail::test_impl
            ("data[0] == null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_iterator_suite.cpp"
             ,0x882,"void dereference_suite::overwrite_array()",v);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void overwrite_array()
{
    variable data = array::make({ true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    auto where = data.begin();
    *where = null;
    TRIAL_PROTOCOL_TEST_EQUAL(data.size(), 7);
    TRIAL_PROTOCOL_TEST(data[0] == null);
}